

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_font * nk_font_atlas_add_compressed
                    (nk_font_atlas *atlas,void *compressed_data,nk_size compressed_size,float height
                    ,nk_font_config *config)

{
  nk_plugin_alloc p_Var1;
  uchar *puVar2;
  long lVar3;
  nk_font *pnVar4;
  ulong uVar5;
  uchar *puVar6;
  byte bVar7;
  uint uVar8;
  nk_font_config *pnVar9;
  ushort *puVar10;
  ushort *puVar11;
  ulong uVar12;
  byte bVar13;
  nk_font_config local_88;
  
  bVar13 = 0;
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34ef,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f0,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f1,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  p_Var1 = (atlas->permanent).alloc;
  if (p_Var1 == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f2,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f3,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (compressed_data == (void *)0x0) {
    __assert_fail("compressed_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f5,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (compressed_size == 0) {
    __assert_fail("compressed_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34f6,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  uVar8 = *(uint *)((long)compressed_data + 8);
  uVar12 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18);
  puVar2 = (uchar *)(*p_Var1)((atlas->permanent).userdata,(void *)0x0,uVar12);
  if (puVar2 == (uchar *)0x0) {
    __assert_fail("decompressed_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x34fd,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  uVar8 = *compressed_data;
  if (((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18) !=
       0x57bc0000) ||
     (uVar8 = *(uint *)((long)compressed_data + 4),
     ((uVar8 >> 0x18 != 0 || (uVar8 & 0xff0000) != 0) || (uVar8 & 0xff00) != 0) ||
     (uVar8 & 0xff) != 0)) {
LAB_001239ff:
    if (config == (nk_font_config *)0x0) {
      local_88.padding[2] = '\0';
      local_88.padding[0] = '\0';
      local_88.padding[1] = '\0';
      local_88.next = (nk_font_config *)0x0;
      local_88.merge_mode = '\0';
      local_88.pixel_snap = '\0';
      local_88.oversample_v = '\x01';
      local_88.oversample_h = '\x03';
      local_88.coord_type = NK_COORD_UV;
      local_88.spacing.x = 0.0;
      local_88.spacing.y = 0.0;
      local_88.range = nk_font_default_glyph_ranges::ranges;
      local_88.font = (nk_baked_font *)0x0;
      local_88.fallback_glyph = 0x3f;
      local_88._68_8_ = 0;
      local_88._76_8_ = 0;
      local_88.p._4_4_ = 0;
    }
    else {
      pnVar9 = &local_88;
      for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
        pnVar9->next = config->next;
        config = (nk_font_config *)((long)config + (ulong)bVar13 * -0x10 + 8);
        pnVar9 = (nk_font_config *)((long)pnVar9 + ((ulong)bVar13 * -2 + 1) * 8);
      }
    }
    local_88.ttf_data_owned_by_atlas = '\x01';
    local_88.ttf_blob = puVar2;
    local_88.ttf_size = uVar12;
    local_88.size = height;
    pnVar4 = nk_font_atlas_add(atlas,&local_88);
    return pnVar4;
  }
  uVar8 = *(uint *)((long)compressed_data + 8);
  nk__barrier3 = (uchar *)((compressed_size & 0xffffffff) + (long)compressed_data);
  puVar6 = puVar2 + (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18
                    );
  puVar10 = (ushort *)((long)compressed_data + 0x10);
  nk__barrier2 = (uchar *)compressed_data;
  nk__barrier = puVar6;
  nk__barrier4 = puVar2;
  nk__dout = puVar2;
  do {
    bVar7 = (byte)*puVar10;
    uVar8 = (uint)bVar7;
    if (bVar7 < 0x20) {
      if (bVar7 < 0x18) {
        if (bVar7 < 0x10) {
          if (bVar7 < 8) {
            if (bVar7 != 4) {
              if (uVar8 == 6) {
                uVar5 = ~((ulong)*(byte *)((long)puVar10 + 3) |
                          (ulong)*(byte *)((long)puVar10 + 1) << 0x10 | (ulong)(byte)puVar10[1] << 8
                         );
                uVar8 = (uint)(byte)puVar10[2];
                goto LAB_0012388e;
              }
              if (uVar8 == 7) {
                nk__lit((byte *)((long)puVar10 + 3),
                        (ushort)(*(ushort *)((long)puVar10 + 1) << 8 |
                                *(ushort *)((long)puVar10 + 1) >> 8) + 1);
                uVar5 = (ulong)(ushort)(*(ushort *)((long)puVar10 + 1) << 8 |
                                       *(ushort *)((long)puVar10 + 1) >> 8);
                lVar3 = 4;
                goto LAB_0012394a;
              }
              goto LAB_001239dd;
            }
            nk__match(nk__dout +
                      ~((ulong)*(byte *)((long)puVar10 + 3) |
                        (ulong)*(byte *)((long)puVar10 + 1) << 0x10 | (ulong)(byte)puVar10[1] << 8),
                      (ushort)(puVar10[2] << 8 | puVar10[2] >> 8) + 1);
            puVar11 = puVar10 + 3;
          }
          else {
            nk__lit((uchar *)(puVar10 + 1),
                    ((uint)bVar7 * 0x100 + (uint)*(byte *)((long)puVar10 + 1)) - 0x7ff);
            uVar5 = (ulong)(ushort)(*puVar10 << 8 | *puVar10 >> 8);
            lVar3 = -0x7fd;
LAB_0012394a:
            puVar11 = (ushort *)((long)puVar10 + uVar5 + lVar3);
            if (puVar11 == puVar10) {
              bVar7 = (byte)*puVar10;
LAB_001239dd:
              if ((bVar7 != 5) || (*(byte *)((long)puVar10 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                              ,0x33e7,
                              "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              if (nk__dout != puVar6) {
                __assert_fail("nk__dout == output + olen",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                              ,0x33e1,
                              "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)"
                             );
              }
              goto LAB_001239ff;
            }
          }
        }
        else {
          uVar5 = -(ulong)(((uint)*(byte *)((long)puVar10 + 1) * 0x100 +
                           ((uint)(byte)puVar10[1] | (uint)bVar7 << 0x10)) - 0xfffff);
          uVar8 = (uint)(ushort)(*(ushort *)((long)puVar10 + 3) << 8 |
                                *(ushort *)((long)puVar10 + 3) >> 8);
LAB_0012388e:
          nk__match(nk__dout + uVar5,uVar8 + 1);
          puVar11 = (ushort *)((long)puVar10 + 5);
        }
      }
      else {
        nk__match(nk__dout +
                  -(ulong)(((uint)*(byte *)((long)puVar10 + 1) * 0x100 +
                           ((uint)(byte)puVar10[1] | (uint)bVar7 << 0x10)) - 0x17ffff),
                  *(byte *)((long)puVar10 + 3) + 1);
        puVar11 = puVar10 + 2;
      }
    }
    else if ((char)bVar7 < '\0') {
      nk__match(nk__dout + ~(ulong)*(byte *)((long)puVar10 + 1),uVar8 - 0x7f);
      puVar11 = puVar10 + 1;
    }
    else {
      if (bVar7 < 0x40) {
        nk__lit((byte *)((long)puVar10 + 1),uVar8 - 0x1f);
        uVar5 = (ulong)(byte)*puVar10;
        lVar3 = -0x1e;
        goto LAB_0012394a;
      }
      nk__match(nk__dout +
                -(ulong)(((uint)*(byte *)((long)puVar10 + 1) + (uint)bVar7 * 0x100) - 0x3fff),
                (byte)puVar10[1] + 1);
      puVar11 = (ushort *)((long)puVar10 + 3);
    }
    puVar10 = puVar11;
    if (puVar6 < nk__dout) {
      __assert_fail("nk__dout <= output + olen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x33eb,
                    "unsigned int nk_decompress(unsigned char *, unsigned char *, unsigned int)");
    }
  } while( true );
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed(struct nk_font_atlas *atlas,
    void *compressed_data, nk_size compressed_size, float height,
    const struct nk_font_config *config)
{
    unsigned int decompressed_size;
    void *decompressed_data;
    struct nk_font_config cfg;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(compressed_data);
    NK_ASSERT(compressed_size);
    if (!atlas || !compressed_data || !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    decompressed_size = nk_decompress_length((unsigned char*)compressed_data);
    decompressed_data = atlas->permanent.alloc(atlas->permanent.userdata,0,decompressed_size);
    NK_ASSERT(decompressed_data);
    if (!decompressed_data) return 0;
    nk_decompress((unsigned char*)decompressed_data, (unsigned char*)compressed_data,
        (unsigned int)compressed_size);

    cfg = (config) ? *config: nk_font_config(height);
    cfg.ttf_blob = decompressed_data;
    cfg.ttf_size = decompressed_size;
    cfg.size = height;
    cfg.ttf_data_owned_by_atlas = 1;
    return nk_font_atlas_add(atlas, &cfg);
}